

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenkoFPM.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenkoFPM::ChElementBeamTaperedTimoshenkoFPM
          (ChElementBeamTaperedTimoshenkoFPM *this)

{
  int iVar1;
  int iVar2;
  
  (this->super_ChElementBeamTaperedTimoshenko).super_ChLoadableU =
       (ChLoadableU)&PTR__ChLoadable_011504f8;
  ChElementBeamTaperedTimoshenko::ChElementBeamTaperedTimoshenko
            (&this->super_ChElementBeamTaperedTimoshenko,&PTR_construction_vtable_24__0117e2d8);
  (this->super_ChElementBeamTaperedTimoshenko).super_ChElementBeam.super_ChElementGeneric.
  super_ChElementBase._vptr_ChElementBase = (_func_int **)0x117df48;
  (this->super_ChElementBeamTaperedTimoshenko).super_ChLoadableU = (ChLoadableU)0x117e138;
  (this->super_ChElementBeamTaperedTimoshenko).super_ChLoadableUVW = (ChLoadableUVW)0x117e220;
  (this->super_ChElementBeamTaperedTimoshenko).super_ChElementCorotational.
  _vptr_ChElementCorotational = (_func_int **)0x117e2b8;
  (this->tapered_section_fpm).
  super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->tapered_section_fpm).
  super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->guass_order = 4;
  ChQuaternion<double>::operator=
            (&(this->super_ChElementBeamTaperedTimoshenko).q_refrotA,(ChQuaternion<double> *)&QUNIT)
  ;
  ChQuaternion<double>::operator=
            (&(this->super_ChElementBeamTaperedTimoshenko).q_refrotB,(ChQuaternion<double> *)&QUNIT)
  ;
  ChQuaternion<double>::operator=
            (&(this->super_ChElementBeamTaperedTimoshenko).q_element_abs_rot,
             (ChQuaternion<double> *)&QUNIT);
  ChQuaternion<double>::operator=
            (&(this->super_ChElementBeamTaperedTimoshenko).q_element_ref_rot,
             (ChQuaternion<double> *)&QUNIT);
  (this->super_ChElementBeamTaperedTimoshenko).disable_corotate = false;
  (this->super_ChElementBeamTaperedTimoshenko).force_symmetric_stiffness = false;
  (this->super_ChElementBeamTaperedTimoshenko).use_geometric_stiffness = true;
  (this->super_ChElementBeamTaperedTimoshenko).use_Rc = true;
  (this->super_ChElementBeamTaperedTimoshenko).use_Rs = true;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::resize(&(this->super_ChElementBeamTaperedTimoshenko).nodes,2);
  iVar1 = (*(this->super_ChElementBeamTaperedTimoshenko).super_ChElementBeam.super_ChElementGeneric.
            super_ChElementBase._vptr_ChElementBase[3])(this);
  iVar2 = (*(this->super_ChElementBeamTaperedTimoshenko).super_ChElementBeam.super_ChElementGeneric.
            super_ChElementBase._vptr_ChElementBase[3])(this);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            (&(this->super_ChElementBeamTaperedTimoshenko).Km.
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,(long)iVar1,
             (long)iVar2);
  iVar1 = (*(this->super_ChElementBeamTaperedTimoshenko).super_ChElementBeam.super_ChElementGeneric.
            super_ChElementBase._vptr_ChElementBase[3])(this);
  iVar2 = (*(this->super_ChElementBeamTaperedTimoshenko).super_ChElementBeam.super_ChElementGeneric.
            super_ChElementBase._vptr_ChElementBase[3])(this);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            (&(this->super_ChElementBeamTaperedTimoshenko).Kg.
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,(long)iVar1,
             (long)iVar2);
  iVar1 = (*(this->super_ChElementBeamTaperedTimoshenko).super_ChElementBeam.super_ChElementGeneric.
            super_ChElementBase._vptr_ChElementBase[3])(this);
  iVar2 = (*(this->super_ChElementBeamTaperedTimoshenko).super_ChElementBeam.super_ChElementGeneric.
            super_ChElementBase._vptr_ChElementBase[3])(this);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            (&(this->super_ChElementBeamTaperedTimoshenko).M.
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,(long)iVar1,
             (long)iVar2);
  iVar1 = (*(this->super_ChElementBeamTaperedTimoshenko).super_ChElementBeam.super_ChElementGeneric.
            super_ChElementBase._vptr_ChElementBase[3])(this);
  iVar2 = (*(this->super_ChElementBeamTaperedTimoshenko).super_ChElementBeam.super_ChElementGeneric.
            super_ChElementBase._vptr_ChElementBase[3])(this);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            (&(this->super_ChElementBeamTaperedTimoshenko).Rm.
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,(long)iVar1,
             (long)iVar2);
  iVar1 = (*(this->super_ChElementBeamTaperedTimoshenko).super_ChElementBeam.super_ChElementGeneric.
            super_ChElementBase._vptr_ChElementBase[3])(this);
  iVar2 = (*(this->super_ChElementBeamTaperedTimoshenko).super_ChElementBeam.super_ChElementGeneric.
            super_ChElementBase._vptr_ChElementBase[3])(this);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            (&(this->super_ChElementBeamTaperedTimoshenko).Ri.
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,(long)iVar1,
             (long)iVar2);
  iVar1 = (*(this->super_ChElementBeamTaperedTimoshenko).super_ChElementBeam.super_ChElementGeneric.
            super_ChElementBase._vptr_ChElementBase[3])(this);
  iVar2 = (*(this->super_ChElementBeamTaperedTimoshenko).super_ChElementBeam.super_ChElementGeneric.
            super_ChElementBase._vptr_ChElementBase[3])(this);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            (&(this->super_ChElementBeamTaperedTimoshenko).Ki.
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,(long)iVar1,
             (long)iVar2);
  iVar1 = (*(this->super_ChElementBeamTaperedTimoshenko).super_ChElementBeam.super_ChElementGeneric.
            super_ChElementBase._vptr_ChElementBase[3])(this);
  iVar2 = (*(this->super_ChElementBeamTaperedTimoshenko).super_ChElementBeam.super_ChElementGeneric.
            super_ChElementBase._vptr_ChElementBase[3])(this);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            (&(this->super_ChElementBeamTaperedTimoshenko).T.
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,(long)iVar1,
             (long)iVar2);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setIdentity
            ((MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)
             &(this->super_ChElementBeamTaperedTimoshenko).Rs,6,6);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setIdentity
            ((MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)
             &(this->super_ChElementBeamTaperedTimoshenko).Rc,6,6);
  return;
}

Assistant:

ChElementBeamTaperedTimoshenkoFPM::ChElementBeamTaperedTimoshenkoFPM() : guass_order(4) {
    q_refrotA = QUNIT;
    q_refrotB = QUNIT;
    q_element_abs_rot = QUNIT;
    q_element_ref_rot = QUNIT;
    force_symmetric_stiffness = false;
    disable_corotate = false;
    use_geometric_stiffness = true;
    use_Rc = true;
    use_Rs = true;

    nodes.resize(2);

    Km.setZero(this->GetNdofs(), this->GetNdofs());
    Kg.setZero(this->GetNdofs(), this->GetNdofs());
    M.setZero(this->GetNdofs(), this->GetNdofs());
    Rm.setZero(this->GetNdofs(), this->GetNdofs());
    Ri.setZero(this->GetNdofs(), this->GetNdofs());
    Ki.setZero(this->GetNdofs(), this->GetNdofs());

    T.setZero(this->GetNdofs(), this->GetNdofs());
    Rs.setIdentity(6, 6);
    Rc.setIdentity(6, 6);
}